

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O2

void __thiscall
tlog::Logger::progress<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (Logger *this,uint64_t current,uint64_t total,
          duration<long,_std::ratio<1L,_1000000L>_> duration)

{
  undefined4 in_EAX;
  size_type sVar1;
  _Base_ptr p_Var2;
  undefined8 in_R9;
  undefined8 uVar3;
  
  uVar3 = CONCAT44(6,in_EAX);
  sVar1 = std::set<tlog::ESeverity,_std::less<tlog::ESeverity>,_std::allocator<tlog::ESeverity>_>::
          count(&this->mHiddenSeverities,(key_type *)&stack0xffffffffffffffcc);
  if (sVar1 == 0) {
    for (p_Var2 = (this->mOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->mOutputs)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      (**(code **)(**(long **)(p_Var2 + 1) + 8))
                (*(long **)(p_Var2 + 1),&this->mScope,current,total,duration.__r,in_R9,uVar3);
    }
  }
  return;
}

Assistant:

void progress(uint64_t current, uint64_t total, T duration) {
            if (mHiddenSeverities.count(ESeverity::Progress)) {
                return;
            }

            duration_t dur = std::chrono::duration_cast<duration_t>(duration);
            for (auto& output : mOutputs) {
                output->writeProgress(mScope, current, total, dur);
            }
        }